

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O3

PyObject * libxml_xmlValidateOneAttribute(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  xmlChar *value;
  PyObject *pyobj_attr;
  PyObject *pyobj_elem;
  PyObject *pyobj_doc;
  PyObject *pyobj_ctxt;
  undefined8 local_38;
  undefined *local_30;
  undefined *local_28;
  undefined *local_20;
  undefined *local_18;
  
  iVar1 = libxml_deprecationWarning("xmlValidateOneAttribute");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT
                      (args,"OOOOz:xmlValidateOneAttribute",&local_18,&local_20,&local_28,&local_30,
                       &local_38);
    if (iVar1 != 0) {
      if (local_18 == &_Py_NoneStruct) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(undefined8 *)(local_18 + 0x10);
      }
      if (local_20 == &_Py_NoneStruct) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(undefined8 *)(local_20 + 0x10);
      }
      if (local_28 == &_Py_NoneStruct) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(undefined8 *)(local_28 + 0x10);
      }
      if (local_30 == &_Py_NoneStruct) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(undefined8 *)(local_30 + 0x10);
      }
      iVar1 = xmlValidateOneAttribute(uVar6,uVar5,uVar4,uVar3,local_38);
      pPVar2 = libxml_intWrap(iVar1);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlValidateOneAttribute(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlValidCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlNodePtr elem;
    PyObject *pyobj_elem;
    xmlAttrPtr attr;
    PyObject *pyobj_attr;
    xmlChar * value;

    if (libxml_deprecationWarning("xmlValidateOneAttribute") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OOOOz:xmlValidateOneAttribute", &pyobj_ctxt, &pyobj_doc, &pyobj_elem, &pyobj_attr, &value))
        return(NULL);
    ctxt = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_ctxt);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    elem = (xmlNodePtr) PyxmlNode_Get(pyobj_elem);
    attr = (xmlAttrPtr) PyxmlNode_Get(pyobj_attr);

    c_retval = xmlValidateOneAttribute(ctxt, doc, elem, attr, value);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}